

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

void server::listdemos(int cn)

{
  undefined4 n;
  int iVar1;
  demofile *t;
  ENetPacket *packet;
  int local_48;
  int i;
  undefined1 local_38 [8];
  packetbuf p;
  int cn_local;
  
  p._36_4_ = cn;
  packetbuf::packetbuf((packetbuf *)local_38,5000,1);
  putint((packetbuf *)local_38,0x48);
  iVar1 = vector<server::demofile>::length((vector<server::demofile> *)demos);
  putint((packetbuf *)local_38,iVar1);
  local_48 = 0;
  while( true ) {
    iVar1 = vector<server::demofile>::length((vector<server::demofile> *)demos);
    n = p._36_4_;
    if (iVar1 <= local_48) break;
    t = vector<server::demofile>::operator[]((vector<server::demofile> *)demos,local_48);
    sendstring(t->info,(packetbuf *)local_38);
    local_48 = local_48 + 1;
  }
  packet = packetbuf::finalize((packetbuf *)local_38);
  sendpacket(n,1,packet,-1);
  packetbuf::~packetbuf((packetbuf *)local_38);
  return;
}

Assistant:

void listdemos(int cn)
    {
        packetbuf p(MAXTRANS, ENET_PACKET_FLAG_RELIABLE);
        putint(p, N_SENDDEMOLIST);
        putint(p, demos.length());
        loopv(demos) sendstring(demos[i].info, p);
        sendpacket(cn, 1, p.finalize());
    }